

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_ego_min(parser *p)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  void *pvVar4;
  ego_item *e;
  wchar_t ta;
  wchar_t td;
  wchar_t th;
  parser *p_local;
  
  wVar1 = parser_getint(p,"th");
  wVar2 = parser_getint(p,"td");
  wVar3 = parser_getint(p,"ta");
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    *(wchar_t *)((long)pvVar4 + 0x238) = wVar1;
    *(wchar_t *)((long)pvVar4 + 0x23c) = wVar2;
    *(wchar_t *)((long)pvVar4 + 0x240) = wVar3;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_ego_min(struct parser *p) {
	int th = parser_getint(p, "th");
	int td = parser_getint(p, "td");
	int ta = parser_getint(p, "ta");
	struct ego_item *e = parser_priv(p);

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	e->min_to_h = th;
	e->min_to_d = td;
	e->min_to_a = ta;
	return PARSE_ERROR_NONE;
}